

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz_encoder.c
# Opt level: O0

uint64_t lzma_lz_encoder_memusage(lzma_lz_options_conflict *lz_options)

{
  _Bool _Var1;
  undefined1 local_90 [8];
  lzma_mf mf;
  lzma_lz_options_conflict *lz_options_local;
  
  mf._112_8_ = lz_options;
  memset(local_90,0,0x78);
  _Var1 = lz_encoder_prepare((lzma_mf *)local_90,(lzma_allocator *)0x0,
                             (lzma_lz_options_conflict *)mf._112_8_);
  if (_Var1) {
    lz_options_local = (lzma_lz_options_conflict *)0xffffffffffffffff;
  }
  else {
    lz_options_local =
         (lzma_lz_options_conflict *)
         (((ulong)mf.match_len_max + (ulong)mf.action) * 4 + (ulong)(uint)mf.buffer + 0xe0);
  }
  return (uint64_t)lz_options_local;
}

Assistant:

extern uint64_t
lzma_lz_encoder_memusage(const lzma_lz_options *lz_options)
{
	// Old buffers must not exist when calling lz_encoder_prepare().
	lzma_mf mf = {
		.buffer = NULL,
		.hash = NULL,
		.son = NULL,
		.hash_count = 0,
		.sons_count = 0,
	};

	// Setup the size information into mf.
	if (lz_encoder_prepare(&mf, NULL, lz_options))
		return UINT64_MAX;

	// Calculate the memory usage.
	return ((uint64_t)(mf.hash_count) + mf.sons_count) * sizeof(uint32_t)
			+ mf.size + sizeof(lzma_coder);
}